

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommonstyle.cpp
# Opt level: O0

void drawArrow(QStyle *style,QStyleOptionToolButton *toolbutton,QRect *rect,QPainter *painter,
              QWidget *widget)

{
  undefined8 in_RCX;
  QStyleOption *this;
  undefined8 *in_RDX;
  long in_RSI;
  long *in_RDI;
  undefined8 in_R8;
  long in_FS_OFFSET;
  PrimitiveElement pe;
  QStyleOption arrowOpt;
  QStyleOption *in_stack_ffffffffffffff78;
  undefined4 local_74;
  undefined1 local_48 [16];
  undefined8 local_38;
  undefined8 local_30;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = (QStyleOption *)(ulong)(*(int *)(in_RSI + 0x78) - 1);
  switch(this) {
  case (QStyleOption *)0x0:
    local_74 = 0x16;
    break;
  case (QStyleOption *)0x1:
    local_74 = 0x13;
    break;
  case (QStyleOption *)0x2:
    local_74 = 0x14;
    break;
  case (QStyleOption *)0x3:
    local_74 = 0x15;
    break;
  default:
    goto switchD_003cf282_default;
  }
  memset(local_48,0xaa,0x40);
  QStyleOption::QStyleOption(this,in_stack_ffffffffffffff78);
  local_38 = *in_RDX;
  local_30 = in_RDX[1];
  (**(code **)(*in_RDI + 0xb0))(in_RDI,local_74,local_48,in_RCX,in_R8);
  QStyleOption::~QStyleOption(this);
switchD_003cf282_default:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void drawArrow(const QStyle *style, const QStyleOptionToolButton *toolbutton,
                      const QRect &rect, QPainter *painter, const QWidget *widget = nullptr)
{
    QStyle::PrimitiveElement pe;
    switch (toolbutton->arrowType) {
    case Qt::LeftArrow:
        pe = QStyle::PE_IndicatorArrowLeft;
        break;
    case Qt::RightArrow:
        pe = QStyle::PE_IndicatorArrowRight;
        break;
    case Qt::UpArrow:
        pe = QStyle::PE_IndicatorArrowUp;
        break;
    case Qt::DownArrow:
        pe = QStyle::PE_IndicatorArrowDown;
        break;
    default:
        return;
    }
    QStyleOption arrowOpt = *toolbutton;
    arrowOpt.rect = rect;
    style->drawPrimitive(pe, &arrowOpt, painter, widget);
}